

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5TextureGatherOffset.cpp
# Opt level: O1

bool __thiscall
glcts::GPUShader5TextureGatherOffsetDepth2DClampToEdgeCaseTest::checkResult
          (GPUShader5TextureGatherOffsetDepth2DClampToEdgeCaseTest *this,
          CapturedVaryings *captured_data,uint index,uint texture_size)

{
  ostringstream *poVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  pointer piVar6;
  TestLog *pTVar7;
  ulong uVar8;
  uint i;
  int iVar9;
  long lVar10;
  ulong uVar11;
  TestError *this_00;
  int iVar12;
  int iVar13;
  bool bVar14;
  GLint expected_values [4];
  string local_210;
  string local_1f0;
  GLint *local_1d0;
  int local_1c8 [6];
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  
  piVar6 = (this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).m_offsets_buffer_data.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  iVar2 = piVar6[index * 2];
  iVar3 = piVar6[(ulong)(index * 2) + 1];
  lVar10 = 0;
  do {
    if (captured_data->without_offset[lVar10] != texture_size) goto LAB_00ccb6a7;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  lVar10 = 0xffffffff;
LAB_00ccb6a7:
  iVar9 = (int)lVar10;
  if (iVar9 == -1) {
    pTVar7 = ((this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
              super_GPUShader5TextureGatherOffsetDepthTestBase.
              super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.super_TestCase.
              super_TestNode.m_testCtx)->m_log;
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f0,"Unexpected sampling results","");
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,0x1b3c1e9);
    tcu::LogSection::LogSection((LogSection *)local_1b0,&local_1f0,&local_210);
    tcu::TestLog::startSection(pTVar7,(char *)local_1b0._0_8_,local_190._M_p);
    tcu::LogSection::~LogSection((LogSection *)local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    GPUShader5TextureGatherOffsetTestBase::logCoordinates
              ((GPUShader5TextureGatherOffsetTestBase *)this,index);
    local_1b0._0_8_ =
         ((this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
          super_GPUShader5TextureGatherOffsetDepthTestBase.
          super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.super_TestCase.
          super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Texture size: ",0xe);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    local_1b0._0_8_ =
         ((this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
          super_GPUShader5TextureGatherOffsetDepthTestBase.
          super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.super_TestCase.
          super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Offsets: ",9);
    std::ostream::operator<<(poVar1,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::operator<<(poVar1,iVar3);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    GPUShader5TextureGatherOffsetDepthTestBase::logVaryings
              ((GPUShader5TextureGatherOffsetDepthTestBase *)this,captured_data);
    tcu::TestLog::endSection
              (((this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
                super_GPUShader5TextureGatherOffsetDepthTestBase.
                super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.super_TestCase.
                super_TestNode.m_testCtx)->m_log);
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unexpected sampling results",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5TextureGatherOffset.cpp"
               ,0xb6f);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_1d0 = captured_data->without_offset;
  iVar4 = captured_data->floor_tex_coord[0];
  iVar5 = captured_data->without_offset[iVar9];
  iVar9 = GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest::checkResult::gather_offsets_x
          [iVar9];
  lVar10 = 0;
  do {
    iVar12 = *(int *)((long)GPUShader5TextureGatherOffsetColor2DClampToBorderCaseTest::checkResult::
                            gather_offsets_x + lVar10) +
             ((iVar5 + iVar2) - iVar9) + iVar4 * texture_size;
    *(int *)((long)local_1c8 + lVar10) = iVar12;
    iVar13 = 0;
    if ((iVar12 < 0) || (iVar13 = texture_size - 1, (int)(texture_size - 1) < iVar12)) {
      *(int *)((long)local_1c8 + lVar10) = iVar13;
    }
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0x10);
  if (captured_data->with_offset[0] == local_1c8[0]) {
    uVar8 = 0;
    do {
      uVar11 = uVar8;
      if (uVar11 == 3) {
        return 2 < uVar11;
      }
      uVar8 = uVar11 + 1;
    } while (captured_data->with_offset[uVar11 + 1] == local_1c8[uVar11 + 1]);
    bVar14 = 2 < uVar11;
  }
  else {
    bVar14 = false;
  }
  pTVar7 = ((this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
            super_GPUShader5TextureGatherOffsetDepthTestBase.
            super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"Invalid result","");
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,0x1b3c1e9);
  tcu::LogSection::LogSection((LogSection *)local_1b0,&local_1f0,&local_210);
  tcu::TestLog::startSection(pTVar7,(char *)local_1b0._0_8_,local_190._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != local_180) {
    operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != &local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  GPUShader5TextureGatherOffsetTestBase::logCoordinates
            ((GPUShader5TextureGatherOffsetTestBase *)this,index);
  local_1b0._0_8_ =
       ((this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
        super_GPUShader5TextureGatherOffsetDepthTestBase.super_GPUShader5TextureGatherOffsetTestBase
        .super_TestCaseBase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Texture size: ",0xe);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  local_1b0._0_8_ =
       ((this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
        super_GPUShader5TextureGatherOffsetDepthTestBase.super_GPUShader5TextureGatherOffsetTestBase
        .super_TestCaseBase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Offsets: ",9);
  std::ostream::operator<<(poVar1,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::operator<<(poVar1,iVar3);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  GPUShader5TextureGatherOffsetTestBase::logArray
            ((GPUShader5TextureGatherOffsetTestBase *)this,local_1d0,4,"Without offset: ");
  GPUShader5TextureGatherOffsetTestBase::logArray
            ((GPUShader5TextureGatherOffsetTestBase *)this,captured_data->with_offset,4,
             "With offset: ");
  tcu::TestLog::endSection
            (((this->super_GPUShader5TextureGatherOffsetDepth2DRepeatCaseTest).
              super_GPUShader5TextureGatherOffsetDepthTestBase.
              super_GPUShader5TextureGatherOffsetTestBase.super_TestCaseBase.super_TestCase.
              super_TestNode.m_testCtx)->m_log);
  return bVar14;
}

Assistant:

bool GPUShader5TextureGatherOffsetDepth2DClampToEdgeCaseTest::checkResult(const CapturedVaryings& captured_data,
																		  unsigned int index, unsigned int texture_size)
{
	/* Get offsets for vertex */
	glw::GLint x_offset;
	glw::GLint y_offset;

	getOffsets(x_offset, y_offset, index);

	/* Storage for expected values of with_offset varyings */
	glw::GLint expected_values[m_n_components_per_varying];

	/* Index of first not clamped texel in without_offset set*/
	int not_clamped_texel_index = -1;

	/* X offsets of texels in 2x2 set */
	static const glw::GLint gather_offsets_x[] = { 0, 1, 1, 0 };

	/* Find first not clamped texel in without_offset set */
	for (unsigned int i = 0; i < m_n_components_per_varying; ++i)
	{
		if ((int)texture_size != captured_data.without_offset[i])
		{
			not_clamped_texel_index = i;
			break;
		}
	}

	if (-1 == not_clamped_texel_index)
	{
		/* Log problem with sampler */
		m_testCtx.getLog() << tcu::TestLog::Section("Unexpected sampling results", "");

		logCoordinates(index);

		m_testCtx.getLog() << tcu::TestLog::Message << "Texture size: " << texture_size << tcu::TestLog::EndMessage;

		m_testCtx.getLog() << tcu::TestLog::Message << "Offsets: " << x_offset << ", " << y_offset
						   << tcu::TestLog::EndMessage;

		logVaryings(captured_data);

		m_testCtx.getLog() << tcu::TestLog::EndSection;

		TCU_FAIL("Unexpected sampling results");
	}

	/* Fraction part of position for lower left texel without_offset set */
	const glw::GLint fract_position_x =
		captured_data.without_offset[not_clamped_texel_index] - gather_offsets_x[not_clamped_texel_index];

	/* Absolute position of lower left corner in without_offset set */
	const glw::GLint absolute_position_x = fract_position_x + captured_data.floor_tex_coord[0] * (int)texture_size;

	/* Calculate expected values of with_offset varyings */
	for (unsigned int i = 0; i < m_n_components_per_varying; ++i)
	{
		expected_values[i] = absolute_position_x + gather_offsets_x[i];
		expected_values[i] += x_offset;

		/* Clamp when point is outside of texture */
		clamp(expected_values[i], 0, ((glw::GLint)texture_size) - 1);
	}

	/* Verify that expected_values match those in with_offset varyings */
	for (unsigned int i = 0; i < m_n_components_per_varying; ++i)
	{
		if (captured_data.with_offset[i] != expected_values[i])
		{
			/* Log invalid results */
			m_testCtx.getLog() << tcu::TestLog::Section("Invalid result", "");

			logCoordinates(index);

			m_testCtx.getLog() << tcu::TestLog::Message << "Texture size: " << texture_size << tcu::TestLog::EndMessage;

			m_testCtx.getLog() << tcu::TestLog::Message << "Offsets: " << x_offset << ", " << y_offset
							   << tcu::TestLog::EndMessage;

			logVaryings(captured_data);

			m_testCtx.getLog() << tcu::TestLog::EndSection;

			/* Done */
			return false;
		}
	}

	/* Done */
	return true;
}